

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww_test.c
# Opt level: O0

bool_t wwTest(void)

{
  bool_t bVar1;
  int iVar2;
  word wVar3;
  size_t sVar4;
  word c [8];
  word b [8];
  word a [8];
  word wStackY_c8;
  size_t in_stack_ffffffffffffff40;
  word *in_stack_ffffffffffffff48;
  word *in_stack_ffffffffffffff50;
  word *in_stack_ffffffffffffff58;
  word *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  word *in_stack_ffffffffffffff70;
  word local_88 [8];
  word local_48;
  word wStack_40;
  word awStack_38 [4];
  long local_18;
  long local_10;
  
  wwSetW(&local_48,8,0);
  bVar1 = wwIsZero(&local_48,8);
  if ((bVar1 != 0) && (bVar1 = wwIsZero_fast(&local_48,8), bVar1 != 0)) {
    wwSetZero(&local_48,8);
    bVar1 = wwIsZero(&local_48,8);
    if ((bVar1 != 0) && (bVar1 = wwIsZero_fast(&local_48,8), bVar1 != 0)) {
      wwSetW(&local_48,8,0x36);
      bVar1 = wwIsZero(&local_48,8);
      if ((((((bVar1 == 0) && (bVar1 = wwIsZero_fast(&local_48,8), bVar1 == 0)) &&
            (bVar1 = wwIsW(&local_48,8,0x36), bVar1 != 0)) &&
           (((bVar1 = wwIsW_fast(&local_48,8,0x36), bVar1 != 0 &&
             (bVar1 = wwIsW(&local_48,8,0x5c), bVar1 == 0)) &&
            (bVar1 = wwIsW_fast(&local_48,8,0x5c), bVar1 == 0)))) &&
          ((iVar2 = wwCmpW(in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
                           in_stack_ffffffffffffff40), iVar2 == 0 &&
           (iVar2 = wwCmpW_fast(&local_48,8,0x36), iVar2 == 0)))) &&
         ((iVar2 = wwCmpW(in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
                          in_stack_ffffffffffffff40), iVar2 < 0 &&
          (iVar2 = wwCmpW_fast(&local_48,8,0x5c), iVar2 < 0)))) {
        wwRepW(&local_48,8,0x36);
        bVar1 = wwIsZero(&local_48,8);
        if ((((bVar1 == 0) && (bVar1 = wwIsZero_fast(&local_48,8), bVar1 == 0)) &&
            (bVar1 = wwIsRepW(&local_48,8,0x36), bVar1 != 0)) &&
           (((bVar1 = wwIsRepW_fast(&local_48,8,0x36), bVar1 != 0 &&
             (bVar1 = wwIsRepW(&local_48,8,0x5c), bVar1 == 0)) &&
            (bVar1 = wwIsRepW_fast(&local_48,8,0x5c), bVar1 == 0)))) {
          wwCopy(&local_48,&local_48,8);
          bVar1 = wwEq(&local_48,&local_48,8);
          if ((bVar1 != 0) && (bVar1 = wwEq_fast(&local_48,&local_48,8), bVar1 != 0)) {
            wwRepW(local_88,8,0x5c);
            bVar1 = wwEq(&local_48,local_88,8);
            if ((bVar1 == 0) &&
               ((((bVar1 = wwEq_fast(&local_48,local_88,8), bVar1 == 0 &&
                  (iVar2 = wwCmp(&local_48,local_88,8), iVar2 < 0)) &&
                 (iVar2 = wwCmp_fast(&local_48,local_88,8), iVar2 < 0)) &&
                ((iVar2 = wwCmp2(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                                 in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48),
                 0 < iVar2 &&
                 (iVar2 = wwCmp2_fast(in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50,
                                      in_stack_ffffffffffffff48,in_stack_ffffffffffffff40),
                 0 < iVar2)))))) {
              wwSwap(&local_48,local_88,8);
              iVar2 = wwCmp(&local_48,local_88,8);
              if ((0 < iVar2) &&
                 (((iVar2 = wwCmp_fast(&local_48,local_88,8), 0 < iVar2 &&
                   (iVar2 = wwCmp2(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                                   in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48),
                   iVar2 < 0)) &&
                  (iVar2 = wwCmp2_fast(in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50,
                                       in_stack_ffffffffffffff48,in_stack_ffffffffffffff40),
                  iVar2 < 0)))) {
                bVar1 = wwTestBit(local_88,0);
                if (((((bVar1 == 0) && (bVar1 = wwTestBit(local_88,1), bVar1 != 0)) &&
                     (bVar1 = wwTestBit(local_88,0x40), bVar1 == 0)) &&
                    ((bVar1 = wwTestBit(local_88,0x41), bVar1 != 0 &&
                     (bVar1 = wwTestBit(local_88,0x3f), bVar1 == 0)))) &&
                   ((bVar1 = wwTestBit(local_88,0x7f), bVar1 == 0 &&
                    ((wVar3 = wwGetBits(local_88,0x40,6), wVar3 == 0x36 &&
                     (wVar3 = wwGetBits(local_88,0x41,5), wVar3 == 0x1b)))))) {
                  wwSetBit(local_88,0x3f,1);
                  bVar1 = wwTestBit(local_88,0x3f);
                  if (bVar1 != 0) {
                    wwFlipBit(local_88,0x3f);
                    bVar1 = wwTestBit(local_88,0x3f);
                    if (bVar1 == 0) {
                      wwSetBit(local_88,0x3f,0);
                      bVar1 = wwTestBit(local_88,0x3f);
                      if (bVar1 == 0) {
                        wwSetBits(local_88,0x3e,7,0x36);
                        wVar3 = wwGetBits(local_88,0x3e,7);
                        if (wVar3 == 0x36) {
                          wwXor(&wStackY_c8,&local_48,local_88,8);
                          wwXor2(&wStackY_c8,&local_48,8);
                          wwXor2(&wStackY_c8,local_88,8);
                          bVar1 = wwIsZero(&wStackY_c8,8);
                          if (bVar1 != 0) {
                            wwCopy(&wStackY_c8,local_88,8);
                            wwXor(&wStackY_c8,&wStackY_c8,&wStackY_c8,8);
                            bVar1 = wwIsZero(&wStackY_c8,8);
                            if (bVar1 != 0) {
                              wwCopy(&wStackY_c8,&local_48,8);
                              wwXor2(&wStackY_c8,&wStackY_c8,8);
                              bVar1 = wwIsZero(&wStackY_c8,8);
                              if (bVar1 != 0) {
                                sVar4 = wwLoZeroBits(in_stack_ffffffffffffff58,
                                                     (size_t)in_stack_ffffffffffffff50);
                                if ((((sVar4 == 2) &&
                                     (sVar4 = wwHiZeroBits(in_stack_ffffffffffffff58,
                                                           (size_t)in_stack_ffffffffffffff50),
                                     sVar4 == 0x39)) &&
                                    (sVar4 = wwLoZeroBits(in_stack_ffffffffffffff58,
                                                          (size_t)in_stack_ffffffffffffff50),
                                    sVar4 == 0x200)) &&
                                   (sVar4 = wwLoZeroBits(in_stack_ffffffffffffff58,
                                                         (size_t)in_stack_ffffffffffffff50),
                                   sVar4 == 0x200)) {
                                  wwCopy(local_88,&local_48,8);
                                  wwTrimHi(local_88,8,0x183);
                                  sVar4 = wwHiZeroBits(in_stack_ffffffffffffff58,
                                                       (size_t)in_stack_ffffffffffffff50);
                                  if (sVar4 == 0x7d) {
                                    wwTrimLo(local_88,8,0x45);
                                    sVar4 = wwLoZeroBits(in_stack_ffffffffffffff58,
                                                         (size_t)in_stack_ffffffffffffff50);
                                    if (sVar4 == 0x46) {
                                      wVar3 = wwShHiCarry(in_stack_ffffffffffffff70,
                                                          in_stack_ffffffffffffff68,
                                                          (size_t)in_stack_ffffffffffffff60,
                                                          (word)in_stack_ffffffffffffff58);
                                      if ((((wVar3 == 0x5c) &&
                                           (bVar1 = wwIsRepW(&local_48,8,0x5c), bVar1 != 0)) &&
                                          (((wVar3 = wwShLoCarry(in_stack_ffffffffffffff60,
                                                                 (size_t)in_stack_ffffffffffffff58,
                                                                 (size_t)in_stack_ffffffffffffff50,
                                                                 (word)in_stack_ffffffffffffff48),
                                            wVar3 == 0x5c &&
                                            ((bVar1 = wwIsRepW(&local_48,8,0x5c), bVar1 != 0 &&
                                             (wVar3 = wwShHiCarry(in_stack_ffffffffffffff70,
                                                                  in_stack_ffffffffffffff68,
                                                                  (size_t)in_stack_ffffffffffffff60,
                                                                  (word)in_stack_ffffffffffffff58),
                                             wVar3 == 0x2e)))) &&
                                           (bVar1 = wwIsRepW(&local_48,8,0x2e), bVar1 != 0)))) &&
                                         ((wVar3 = wwShLoCarry(in_stack_ffffffffffffff60,
                                                               (size_t)in_stack_ffffffffffffff58,
                                                               (size_t)in_stack_ffffffffffffff50,
                                                               (word)in_stack_ffffffffffffff48),
                                          wVar3 == 0x5c &&
                                          (bVar1 = wwIsRepW(&local_48,8,0x5c), bVar1 != 0)))) {
                                        wwShHi(in_stack_ffffffffffffff50,
                                               (size_t)in_stack_ffffffffffffff48,
                                               in_stack_ffffffffffffff40);
                                        bVar1 = wwIsRepW(&wStack_40,7,0x5c);
                                        if ((bVar1 != 0) && (local_48 == 0)) {
                                          wwShLo(in_stack_ffffffffffffff50,
                                                 (size_t)in_stack_ffffffffffffff48,
                                                 in_stack_ffffffffffffff40);
                                          bVar1 = wwIsRepW(&local_48,6,0x5c);
                                          if (((bVar1 != 0) && (local_18 == 0)) && (local_10 == 0))
                                          {
                                            wwShHi(in_stack_ffffffffffffff50,
                                                   (size_t)in_stack_ffffffffffffff48,
                                                   in_stack_ffffffffffffff40);
                                            bVar1 = wwIsRepW(awStack_38,4,0x2e);
                                            if (bVar1 != 0) {
                                              wwShLo(in_stack_ffffffffffffff50,
                                                     (size_t)in_stack_ffffffffffffff48,
                                                     in_stack_ffffffffffffff40);
                                              bVar1 = wwIsRepW(awStack_38,2,0x5c);
                                              if (bVar1 != 0) {
                                                return 1;
                                              }
                                            }
                                          }
                                        }
                                      }
                                      return 0;
                                    }
                                  }
                                }
                                return 0;
                              }
                            }
                          }
                          return 0;
                        }
                      }
                    }
                  }
                }
                return 0;
              }
            }
          }
          return 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

bool_t wwTest()
{
	word a[8];
	word b[8];
	word c[8];
	// заполнение и сравнение
	if ((wwSetW(a, COUNT_OF(a), 0), FALSE) ||
			!SAFE(wwIsZero)(a, 8) || !FAST(wwIsZero)(a, 8) ||
		(wwSetZero(a, COUNT_OF(a)), FALSE) ||
			!SAFE(wwIsZero)(a, 8) || !FAST(wwIsZero)(a, 8) ||
		(wwSetW(a, COUNT_OF(a), 0x36), FALSE) ||
			SAFE(wwIsZero)(a, 8) || FAST(wwIsZero)(a, 8) ||
			!SAFE(wwIsW)(a, 8, 0x36) || !FAST(wwIsW)(a, 8, 0x36) ||
			SAFE(wwIsW)(a, 8, 0x5C) || FAST(wwIsW)(a, 8, 0x5C) ||
			SAFE(wwCmpW)(a, 8, 0x36) != 0 || FAST(wwCmpW)(a, 8, 0x36) != 0 ||
			SAFE(wwCmpW)(a, 8, 0x5C) >=0 || FAST(wwCmpW)(a, 8, 0x5C) >= 0 ||
		(wwRepW(a, COUNT_OF(a), 0x36), FALSE) ||
			SAFE(wwIsZero)(a, 8) || FAST(wwIsZero)(a, 8) ||
			!SAFE(wwIsRepW)(a, 8, 0x36) || !FAST(wwIsRepW)(a, 8, 0x36) ||
			SAFE(wwIsRepW)(a, 8, 0x5C) || FAST(wwIsRepW)(a, 8, 0x5C))
		return FALSE;
	// копирование и сравнение
	if ((wwCopy(a, a, 8), FALSE) ||
			!SAFE(wwEq)(a, a, 8) || !FAST(wwEq)(a, a, 8) ||
		(wwRepW(b, 8, 0x5C), FALSE) ||
			SAFE(wwEq)(a, b, 8) || FAST(wwEq)(a, b, 8) ||
			SAFE(wwCmp)(a, b, 8) >= 0 || FAST(wwCmp)(a, b, 8) >= 0 ||
			SAFE(wwCmp2)(a, 8, b, 7) <= 0 || FAST(wwCmp2)(a, 8, b, 7) <= 0 ||
		(wwSwap(a, b, 8), FALSE) ||
			SAFE(wwCmp)(a, b, 8) <= 0 || FAST(wwCmp)(a, b, 8) <= 0 ||
			SAFE(wwCmp2)(a, 7, b, 8) >= 0 || FAST(wwCmp2)(a, 7, b, 8) >= 0)
		return FALSE;
	// операции с битами
	ASSERT(wwIsRepW(b, 8, 0x36));
	if (wwTestBit(b, 0) || !wwTestBit(b, 1) ||
		wwTestBit(b, 0 + B_PER_W) || !wwTestBit(b, 1 + B_PER_W) ||
		wwTestBit(b, B_PER_W - 1) || wwTestBit(b, 2 * B_PER_W - 1) ||
		wwGetBits(b, B_PER_W, 6) != 0x36 ||
		wwGetBits(b, B_PER_W + 1, 5) != (0x36 >> 1) ||
		(wwSetBit(b, B_PER_W - 1, TRUE), FALSE) ||
			!wwTestBit(b, B_PER_W - 1) ||
		(wwFlipBit(b, B_PER_W - 1), FALSE) ||
			wwTestBit(b, B_PER_W - 1) ||
		(wwSetBit(b, B_PER_W - 1, FALSE), FALSE) ||
			wwTestBit(b, B_PER_W - 1) ||
		(wwSetBits(b, B_PER_W - 2, 7, 0x36), FALSE) ||
			wwGetBits(b, B_PER_W - 2, 7) != 0x36)
		return FALSE;
	// XOR
	if ((wwXor(c, a, b, 8), wwXor2(c, a, 8), wwXor2(c, b, 8), FALSE) ||
			!wwIsZero(c, 8) ||
		(wwCopy(c, b, 8), wwXor(c, c, c, 8), FALSE) ||
			!wwIsZero(c, 8) ||
		(wwCopy(c, a, 8), wwXor2(c, c, 8), FALSE) ||
			!wwIsZero(c, 8))
		return FALSE;
	// нулевые разряды
	ASSERT(wwIsRepW(a, 8, 0x5C) && wwIsZero(c, 8));
	if (wwLoZeroBits(a, 8) != 2 ||
		wwHiZeroBits(a, 8) != B_PER_W - 7 ||
		wwLoZeroBits(c, 8) != B_PER_W * 8 ||
		wwLoZeroBits(c, 8) != B_PER_W * 8 ||
		(wwCopy(b, a, 8), wwTrimHi(b, 8, 6 * B_PER_W + 3), FALSE) ||
			wwHiZeroBits(b, 8) != 2 * B_PER_W - 3 ||
		(wwTrimLo(b, 8, B_PER_W + 5), FALSE) ||
			wwLoZeroBits(b, 8) != B_PER_W + 6)
		return FALSE;
	// сдвиги
	ASSERT(wwIsRepW(a, 8, 0x5C));
	if (wwShHiCarry(a, 8, B_PER_W, 0x5C) != 0x5C ||
		!wwIsRepW(a, 8, 0x5C) ||
		wwShLoCarry(a, 8, B_PER_W, 0x5C) != 0x5C ||
		!wwIsRepW(a, 8, 0x5C) ||
		wwShHiCarry(a, 8, B_PER_W - 1, 0x5C) != (0x5C >> 1) ||
		!wwIsRepW(a, 8, 0x5C >> 1) ||
		wwShLoCarry(a, 8, B_PER_W - 1, 0x5C >> 1) != 0x5C ||
		!wwIsRepW(a, 8, 0x5C) ||
		(wwShHi(a, 8, B_PER_W), FALSE) ||
			!wwIsRepW(a + 1, 7, 0x5C) || a[0] != 0 ||
		(wwShLo(a, 8, 2 * B_PER_W), FALSE) ||
			!wwIsRepW(a, 6, 0x5C) || a[6] != 0 || a[7] != 0 ||
		(wwShHi(a, 6, 2 * B_PER_W - 1), FALSE) ||
			!wwIsRepW(a + 2, 4, 0x5C >> 1) ||
		(wwShLo(a + 2, 4, 2 * B_PER_W - 1), FALSE) ||
			!wwIsRepW(a + 2, 2, 0x5C))
		return FALSE;
	// все нормально
	return TRUE;
}